

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O2

void grd_stcheck(grd_st_t *grd_st,uint32_t len)

{
  uint uVar1;
  double *pdVar2;
  uint32_t *puVar3;
  ulong N;
  size_t size;
  ulong N_00;
  
  if ((len == 0) || (uVar1 = grd_st->len, uVar1 != 0 && uVar1 < len)) {
    if (grd_st->mdl->opt->sparse == true) {
      xvm_free(grd_st->psiuni);
      grd_st->psiuni = (double *)0x0;
      free(grd_st->psiyp);
      grd_st->psiyp = (uint32_t *)0x0;
      free(grd_st->psiidx);
      grd_st->psiidx = (uint32_t *)0x0;
      free(grd_st->psioff);
      grd_st->psioff = (uint32_t *)0x0;
    }
    xvm_free(grd_st->psi);
    grd_st->psi = (double *)0x0;
    xvm_free(grd_st->alpha);
    grd_st->alpha = (double *)0x0;
    xvm_free(grd_st->beta);
    grd_st->beta = (double *)0x0;
    xvm_free(grd_st->unorm);
    grd_st->unorm = (double *)0x0;
    xvm_free(grd_st->bnorm);
    grd_st->bnorm = (double *)0x0;
    xvm_free(grd_st->scale);
    grd_st->scale = (double *)0x0;
    grd_st->len = 0;
    uVar1 = 0;
    if (len == 0) {
      return;
    }
  }
  if (uVar1 < len) {
    uVar1 = grd_st->mdl->nlbl;
    N = (ulong)(uVar1 * len);
    pdVar2 = xvm_new((ulong)(uVar1 * len * uVar1));
    grd_st->psi = pdVar2;
    pdVar2 = xvm_new(N);
    grd_st->alpha = pdVar2;
    pdVar2 = xvm_new(N);
    grd_st->beta = pdVar2;
    N_00 = (ulong)len;
    pdVar2 = xvm_new(N_00);
    grd_st->scale = pdVar2;
    pdVar2 = xvm_new(N_00);
    grd_st->unorm = pdVar2;
    pdVar2 = xvm_new(N_00);
    grd_st->bnorm = pdVar2;
    if (grd_st->mdl->opt->sparse == true) {
      pdVar2 = xvm_new(N);
      grd_st->psiuni = pdVar2;
      size = N_00 * 4 * (ulong)uVar1;
      puVar3 = (uint32_t *)xmalloc(uVar1 * size);
      grd_st->psiyp = puVar3;
      puVar3 = (uint32_t *)xmalloc(size);
      grd_st->psiidx = puVar3;
      puVar3 = (uint32_t *)xmalloc(N_00 * 4);
      grd_st->psioff = puVar3;
    }
    grd_st->len = len;
  }
  return;
}

Assistant:

void grd_stcheck(grd_st_t *grd_st, uint32_t len) {
	// Check if user ask for clearing the state tracker or if he requested a
	// bigger tracker. In this case we have to free the previous allocated
	// memory.
	if (len == 0 || (len > grd_st->len && grd_st->len != 0)) {
		if (grd_st->mdl->opt->sparse) {
			xvm_free(grd_st->psiuni); grd_st->psiuni = NULL;
			free(grd_st->psiyp);      grd_st->psiyp  = NULL;
			free(grd_st->psiidx);     grd_st->psiidx = NULL;
			free(grd_st->psioff);     grd_st->psioff = NULL;
		}
		xvm_free(grd_st->psi);   grd_st->psi   = NULL;
		xvm_free(grd_st->alpha); grd_st->alpha = NULL;
		xvm_free(grd_st->beta);  grd_st->beta  = NULL;
		xvm_free(grd_st->unorm); grd_st->unorm = NULL;
		xvm_free(grd_st->bnorm); grd_st->bnorm = NULL;
		xvm_free(grd_st->scale); grd_st->scale = NULL;
		grd_st->len = 0;
	}
	if (len == 0 || len <= grd_st->len)
		return;
	// If we are here, we have to allocate a new state. This is simple, we
	// just have to take care of the special case for sparse mode.
	const uint32_t Y = grd_st->mdl->nlbl;
	const uint32_t T = len;
	grd_st->psi   = xvm_new(T * Y * Y);
	grd_st->alpha = xvm_new(T * Y);
	grd_st->beta  = xvm_new(T * Y);
	grd_st->scale = xvm_new(T);
	grd_st->unorm = xvm_new(T);
	grd_st->bnorm = xvm_new(T);
	if (grd_st->mdl->opt->sparse) {
		grd_st->psiuni = xvm_new(T * Y);
		grd_st->psiyp  = xmalloc(sizeof(uint32_t) * T * Y * Y);
		grd_st->psiidx = xmalloc(sizeof(uint32_t) * T * Y);
		grd_st->psioff = xmalloc(sizeof(uint32_t) * T);
	}
	grd_st->len = len;
}